

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

bool __thiscall helics::CommonCore::checkAndProcessDisconnect(CommonCore *this)

{
  BrokerBase *this_00;
  bool bVar1;
  rep rVar2;
  ActionMessage dis;
  ActionMessage local_d0;
  
  if ((CONNECTED_ERROR < (this->super_BrokerBase).brokerState._M_i) &&
     ((this->super_BrokerBase).brokerState._M_i < ERRORED)) {
    return true;
  }
  bVar1 = allDisconnected(this);
  if (bVar1) {
    this_00 = &this->super_BrokerBase;
    checkInFlightQueriesForDisconnect(this);
    BrokerBase::setBrokerState(this_00,TERMINATING);
    BaseTimeCoordinator::disconnect
              ((this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    if ((this->super_BrokerBase).enable_profiling == true) {
      BrokerBase::writeProfilingData(this_00);
    }
    ActionMessage::ActionMessage(&local_d0,cmd_disconnect);
    local_d0.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    local_d0.dest_id.gid = 0;
    (*(this->super_Core)._vptr_Core[0x6b])(this,0,&local_d0);
    BrokerBase::setTickForwarding(this_00,DISCONNECT_TIMEOUT,true);
    rVar2 = std::chrono::_V2::steady_clock::now();
    (this->super_BrokerBase).disconnectTime.__d.__r = rVar2;
    if (this->filterFed != (FilterFederate *)0x0) {
      local_d0.source_id.gid = (this->filterFedID)._M_i.gid;
      FilterFederate::handleMessage(this->filterFed,&local_d0);
    }
  }
  else {
    if ((this->translatorFed == (TranslatorFederate *)0x0) ||
       (bVar1 = TranslatorFederate::hasActiveTimeDependencies(this->translatorFed), bVar1)) {
      return false;
    }
    ActionMessage::ActionMessage(&local_d0,cmd_disconnect);
    local_d0.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    (*(this->super_Core)._vptr_Core[0x6b])(this,0,&local_d0);
    local_d0.source_id.gid = (this->translatorFedID)._M_i.gid;
    TranslatorFederate::handleMessage(this->translatorFed,&local_d0);
  }
  ActionMessage::~ActionMessage(&local_d0);
  return true;
}

Assistant:

bool CommonCore::checkAndProcessDisconnect()
{
    if ((getBrokerState() >= BrokerState::TERMINATING) &&
        (getBrokerState() <= BrokerState::TERMINATED)) {
        return true;
    }
    if (allDisconnected()) {
        checkInFlightQueriesForDisconnect();
        setBrokerState(BrokerState::TERMINATING);
        timeCoord->disconnect();
        if (enable_profiling) {
            writeProfilingData();
        }

        ActionMessage dis(CMD_DISCONNECT);
        dis.source_id = global_broker_id_local;
        dis.dest_id = parent_broker_id;
        transmit(parent_route_id, dis);
        setTickForwarding(TickForwardingReasons::DISCONNECT_TIMEOUT, true);
        disconnectTime = std::chrono::steady_clock::now();
        if (filterFed != nullptr) {
            dis.source_id = filterFedID;
            filterFed->handleMessage(dis);
        }

        return true;
    }
    if (translatorFed != nullptr) {
        if (!translatorFed->hasActiveTimeDependencies()) {
            ActionMessage dis(CMD_DISCONNECT);
            dis.source_id = global_broker_id_local;
            transmit(parent_route_id, dis);
            dis.source_id = translatorFedID;
            translatorFed->handleMessage(dis);
            return true;
        }
    }
    return false;
}